

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O3

StatelessGenerator<std::array<bool,_5UL>_> __thiscall
cppqc::arrayOf<bool,5ul>(cppqc *this,StatelessGenerator<bool> *g)

{
  __uniq_ptr_impl<cppqc::detail::StatelessGenConcept<bool>,_std::default_delete<cppqc::detail::StatelessGenConcept<bool>_>_>
  local_10;
  
  local_10._M_t.
  super__Tuple_impl<0UL,_cppqc::detail::StatelessGenConcept<bool>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<bool>_>_>
  .super__Head_base<0UL,_cppqc::detail::StatelessGenConcept<bool>_*,_false>._M_head_impl =
       (tuple<cppqc::detail::StatelessGenConcept<bool>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<bool>_>_>
        )(**(code **)((long)((g->m_gen)._M_t.
                             super___uniq_ptr_impl<cppqc::detail::StatelessGenConcept<bool>,_std::default_delete<cppqc::detail::StatelessGenConcept<bool>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cppqc::detail::StatelessGenConcept<bool>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<bool>_>_>
                             .
                             super__Head_base<0UL,_cppqc::detail::StatelessGenConcept<bool>_*,_false>
                            ._M_head_impl)->super_GenConcept<bool> + 0x20))();
  StatelessGenerator<std::array<bool,5ul>>::
  StatelessGenerator<cppqc::detail::ArrayOfStatelessGenerator<bool,5ul>>
            ((StatelessGenerator<std::array<bool,5ul>> *)this,
             (ArrayOfStatelessGenerator<bool,_5UL> *)&local_10);
  if ((_Tuple_impl<0UL,_cppqc::detail::StatelessGenConcept<bool>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<bool>_>_>
       )local_10._M_t.
        super__Tuple_impl<0UL,_cppqc::detail::StatelessGenConcept<bool>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<bool>_>_>
        .super__Head_base<0UL,_cppqc::detail::StatelessGenConcept<bool>_*,_false>._M_head_impl !=
      (StatelessGenConcept<bool> *)0x0) {
    (**(code **)(*(long *)local_10._M_t.
                          super__Tuple_impl<0UL,_cppqc::detail::StatelessGenConcept<bool>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<bool>_>_>
                          .super__Head_base<0UL,_cppqc::detail::StatelessGenConcept<bool>_*,_false>.
                          _M_head_impl + 8))();
  }
  return (unique_ptr<cppqc::detail::StatelessGenConcept<std::array<bool,_5UL>_>,_std::default_delete<cppqc::detail::StatelessGenConcept<std::array<bool,_5UL>_>_>_>
          )(unique_ptr<cppqc::detail::StatelessGenConcept<std::array<bool,_5UL>_>,_std::default_delete<cppqc::detail::StatelessGenConcept<std::array<bool,_5UL>_>_>_>
            )this;
}

Assistant:

StatelessGenerator<std::array<T, N>> arrayOf(
    const StatelessGenerator<T>& g = Arbitrary<T>()) {
  return detail::ArrayOfStatelessGenerator<T, N>(g);
}